

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_hal.cpp
# Opt level: O1

MPP_RET mpp_hal_deinit(MppHal ctx)

{
  MPP_RET MVar1;
  
  if (ctx == (MppHal)0x0) {
    _mpp_log_l(2,"mpp_hal","found NULL input\n","mpp_hal_deinit");
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    (**(code **)(*(long *)((long)ctx + 8) + 0x20))(*ctx);
    mpp_osal_free("mpp_hal_deinit",*ctx);
    mpp_osal_free("mpp_hal_deinit",ctx);
    MVar1 = MPP_OK;
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_hal_deinit(MppHal ctx)
{
    if (NULL == ctx) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppHalImpl *p = (MppHalImpl*)ctx;
    p->api->deinit(p->ctx);
    mpp_free(p->ctx);
    mpp_free(p);
    return MPP_OK;
}